

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTriangleTorus.h
# Opt level: O0

void __thiscall
pzgeom::TPZTriangleTorus::Write(TPZTriangleTorus *this,TPZStream *buf,int withclassid)

{
  undefined4 in_EDX;
  TPZFNMatrix<12,_double> *in_RSI;
  TPZGeoTriangle *in_RDI;
  TPZStream *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  
  TPZGeoTriangle::Write(in_RDI,in_stack_ffffffffffffffd8,0);
  (*(in_RSI->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[8])(in_RSI,in_RDI + 1,1);
  (*(in_RSI->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[8])
            (in_RSI,in_RDI[1].super_TPZNodeRep<3,_pztopology::TPZTriangle>.fNodeIndexes,1);
  TPZFNMatrix<12,_double>::Write
            (in_RSI,(TPZStream *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
             (int)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

void Write(TPZStream &buf, int withclassid) const override
        {
            pzgeom::TPZGeoTriangle::Write(buf, withclassid);
            buf.Write(&fR);
            buf.Write(&fr);
            fPhiTheta.Write(buf, 0);
		}